

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::DriveCustomCommands
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmCommonTargetGenerator *pcVar1;
  pointer ppcVar2;
  string *config;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  pointer ppcVar3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmCustomCommandGenerator ccg;
  allocator<char> local_121;
  cmMakefileTargetGenerator *local_120;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  string local_f8;
  cmCustomCommandGenerator local_d8;
  
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_01 = (this->super_cmCommonTargetGenerator).Makefile;
  local_120 = this;
  local_100 = depends;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"CMAKE_BUILD_TYPE",&local_121);
  config = cmMakefile::GetSafeDefinition(this_01,(string *)&local_d8);
  cmGeneratorTarget::GetSourceFiles
            (this_00,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_118,config);
  std::__cxx11::string::~string((string *)&local_d8);
  ppcVar2 = local_118._M_impl.super__Vector_impl_data._M_finish;
  pcVar1 = &local_120->super_cmCommonTargetGenerator;
  for (ppcVar3 = local_118._M_impl.super__Vector_impl_data._M_start; ppcVar3 != ppcVar2;
      ppcVar3 = ppcVar3 + 1) {
    cc = cmSourceFile::GetCustomCommand(*ppcVar3);
    if (cc != (cmCustomCommand *)0x0) {
      std::__cxx11::string::string((string *)&local_f8,(string *)&pcVar1->ConfigName);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_d8,cc,&local_f8,(cmLocalGenerator *)local_120->LocalGenerator);
      std::__cxx11::string::~string((string *)&local_f8);
      r = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&local_d8);
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (local_100,r);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_d8);
    }
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_118);
  return;
}

Assistant:

void cmMakefileTargetGenerator::DriveCustomCommands(
  std::vector<std::string>& depends)
{
  // Depend on all custom command outputs.
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(
    sources, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  for (cmSourceFile* source : sources) {
    if (cmCustomCommand* cc = source->GetCustomCommand()) {
      cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                   this->LocalGenerator);
      cmAppend(depends, ccg.GetOutputs());
    }
  }
}